

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::InitEdge(TEdge *e,TEdge *eNext,TEdge *ePrev,IntPoint *pt,PolyType polyType)

{
  PolyType polyType_local;
  IntPoint *pt_local;
  TEdge *ePrev_local;
  TEdge *eNext_local;
  TEdge *e_local;
  
  memset(e,0,0x90);
  e->next = eNext;
  e->prev = ePrev;
  e->xcurr = pt->X;
  e->ycurr = pt->Y;
  if (e->ycurr < e->next->ycurr) {
    e->xtop = e->xcurr;
    e->ytop = e->ycurr;
    e->xbot = e->next->xcurr;
    e->ybot = e->next->ycurr;
    e->windDelta = -1;
  }
  else {
    e->xbot = e->xcurr;
    e->ybot = e->ycurr;
    e->xtop = e->next->xcurr;
    e->ytop = e->next->ycurr;
    e->windDelta = 1;
  }
  SetDx(e);
  e->polyType = polyType;
  e->outIdx = -1;
  return;
}

Assistant:

void InitEdge(TEdge *e, TEdge *eNext,
  TEdge *ePrev, const IntPoint &pt, PolyType polyType)
{
  std::memset( e, 0, sizeof( TEdge ));

  e->next = eNext;
  e->prev = ePrev;
  e->xcurr = pt.X;
  e->ycurr = pt.Y;
  if (e->ycurr >= e->next->ycurr)
  {
    e->xbot = e->xcurr;
    e->ybot = e->ycurr;
    e->xtop = e->next->xcurr;
    e->ytop = e->next->ycurr;
    e->windDelta = 1;
  } else
  {
    e->xtop = e->xcurr;
    e->ytop = e->ycurr;
    e->xbot = e->next->xcurr;
    e->ybot = e->next->ycurr;
    e->windDelta = -1;
  }
  SetDx(*e);
  e->polyType = polyType;
  e->outIdx = -1;
}